

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dBox2dCollisionAlgorithm.cpp
# Opt level: O1

void b2CollidePolygons(btManifoldResult *manifold,btBox2dShape *polyA,btTransform *xfA,
                      btBox2dShape *polyB,btTransform *xfB)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar9;
  bool bVar10;
  int iVar11;
  btTransform *pbVar12;
  btVector3 bVar13;
  btManifoldResult *pbVar14;
  int iVar15;
  btBox2dShape *pbVar16;
  int i;
  long lVar17;
  int *piVar18;
  int iVar19;
  ulong uVar20;
  btScalar *pbVar21;
  ulong uVar22;
  btVector3 *pbVar23;
  ClipVertex *vOut;
  btScalar bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  int edgeB;
  int edgeA;
  ClipVertex incidentEdge [2];
  float local_1d8;
  btVector3 local_1b8;
  undefined1 local_1a8 [16];
  ulong local_198;
  ulong uStack_190;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  float local_128;
  btManifoldResult *local_118;
  int local_110 [2];
  btVector3 local_108;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  ClipVertex local_b8;
  undefined8 local_a4;
  undefined8 uStack_9c;
  ClipVertex local_88;
  undefined1 local_74 [16];
  ClipVertex local_58;
  undefined8 local_44;
  undefined8 uStack_3c;
  
  local_110[1] = 0;
  local_128 = FindMaxSeparation(local_110 + 1,polyA,xfA,polyB,xfB);
  if (local_128 <= 0.0) {
    local_110[0] = 0;
    local_118 = manifold;
    bVar24 = FindMaxSeparation(local_110,polyB,xfB,polyA,xfA);
    pbVar14 = local_118;
    if (bVar24 <= 0.0) {
      local_128 = local_128 * 0.98 + 0.001;
      pbVar16 = polyA;
      pbVar12 = xfA;
      if (bVar24 <= local_128) {
        pbVar16 = polyB;
        pbVar12 = xfB;
        xfB = xfA;
      }
      fVar34 = (xfB->m_basis).m_el[2].m_floats[2];
      fVar1 = (xfB->m_basis).m_el[2].m_floats[1];
      fVar2 = (xfB->m_basis).m_el[2].m_floats[0];
      fVar27 = (xfB->m_basis).m_el[1].m_floats[2];
      fVar43 = (xfB->m_basis).m_el[1].m_floats[1];
      fVar37 = (xfB->m_basis).m_el[1].m_floats[0];
      fVar41 = (xfB->m_basis).m_el[0].m_floats[2];
      fVar40 = (xfB->m_basis).m_el[0].m_floats[0];
      fVar38 = (xfB->m_basis).m_el[0].m_floats[1];
      fVar32 = (pbVar12->m_basis).m_el[0].m_floats[0];
      piVar18 = local_110;
      if (bVar24 <= local_128) {
        piVar18 = local_110 + 1;
      }
      iVar15 = *piVar18;
      if (bVar24 <= local_128) {
        polyB = polyA;
      }
      fVar33 = polyB->m_normals[iVar15].m_floats[0];
      fVar25 = polyB->m_normals[iVar15].m_floats[1];
      local_188 = ZEXT416((uint)fVar38);
      local_178 = ZEXT416((uint)fVar40);
      fVar26 = polyB->m_normals[iVar15].m_floats[2];
      local_168 = ZEXT416((uint)fVar41);
      fVar35 = fVar41 * fVar26 + fVar40 * fVar33 + fVar38 * fVar25;
      local_158 = ZEXT416((uint)fVar43);
      local_148 = ZEXT416((uint)fVar37);
      local_138 = ZEXT416((uint)fVar27);
      fVar31 = fVar27 * fVar26 + fVar37 * fVar33 + fVar43 * fVar25;
      fVar28 = (pbVar12->m_basis).m_el[1].m_floats[0];
      fVar36 = fVar26 * fVar34 + fVar33 * fVar2 + fVar25 * fVar1;
      fVar33 = (pbVar12->m_basis).m_el[2].m_floats[0];
      fVar25 = (pbVar12->m_basis).m_el[1].m_floats[1];
      fVar26 = (pbVar12->m_basis).m_el[0].m_floats[1];
      fVar29 = (pbVar12->m_basis).m_el[2].m_floats[1];
      fVar30 = (pbVar12->m_basis).m_el[1].m_floats[2];
      fVar3 = (pbVar12->m_basis).m_el[0].m_floats[2];
      fVar4 = (pbVar12->m_basis).m_el[2].m_floats[2];
      pbVar21 = pbVar16->m_normals[0].m_floats + 2;
      uVar22 = 0;
      uVar20 = 0;
      fVar5 = (xfB->m_origin).m_floats[2];
      fVar6 = (xfB->m_origin).m_floats[1];
      fVar7 = (xfB->m_origin).m_floats[0];
      fVar8 = (pbVar12->m_origin).m_floats[2];
      uVar9 = *(undefined8 *)(pbVar12->m_origin).m_floats;
      fVar39 = 1e+18;
      do {
        fVar42 = *pbVar21 * (fVar36 * fVar4 + fVar35 * fVar3 + fVar31 * fVar30) +
                 ((btVector3 *)(pbVar21 + -2))->m_floats[0] *
                 (fVar33 * fVar36 + fVar32 * fVar35 + fVar28 * fVar31) +
                 pbVar21[-1] * (fVar29 * fVar36 + fVar26 * fVar35 + fVar25 * fVar31);
        if (fVar42 < fVar39) {
          uVar20 = uVar22 & 0xffffffff;
          fVar39 = fVar42;
        }
        uVar22 = uVar22 + 1;
        pbVar21 = pbVar21 + 4;
      } while (uVar22 != 4);
      iVar11 = (int)uVar20;
      iVar19 = 0;
      if (iVar11 < 3) {
        iVar19 = iVar11 + 1;
      }
      fVar39 = pbVar16->m_vertices[iVar11].m_floats[0];
      fVar31 = pbVar16->m_vertices[iVar11].m_floats[1];
      fVar35 = pbVar16->m_vertices[iVar11].m_floats[2];
      fVar36 = (float)uVar9;
      fVar42 = (float)((ulong)uVar9 >> 0x20);
      local_88.v.m_floats[1] = fVar35 * fVar30 + fVar39 * fVar28 + fVar31 * fVar25 + fVar42;
      local_88.v.m_floats[0] = fVar35 * fVar3 + fVar39 * fVar32 + fVar31 * fVar26 + fVar36;
      local_88.v.m_floats[2] = fVar35 * fVar4 + fVar39 * fVar33 + fVar29 * fVar31 + fVar8;
      local_88.v.m_floats[3] = 0.0;
      fVar39 = pbVar16->m_vertices[iVar19].m_floats[0];
      fVar31 = pbVar16->m_vertices[iVar19].m_floats[1];
      fVar35 = pbVar16->m_vertices[iVar19].m_floats[2];
      local_74._4_4_ = fVar35 * fVar30 + fVar39 * fVar28 + fVar31 * fVar25 + fVar42;
      local_74._0_4_ = fVar35 * fVar3 + fVar39 * fVar32 + fVar31 * fVar26 + fVar36;
      local_74._8_4_ = fVar4 * fVar35 + fVar33 * fVar39 + fVar29 * fVar31 + fVar8;
      local_74._12_4_ = 0;
      local_198 = *(ulong *)polyB->m_vertices[iVar15].m_floats;
      fVar33 = (float)(local_198 >> 0x20);
      fVar32 = (float)*(undefined8 *)(polyB->m_vertices[iVar15].m_floats + 2);
      pbVar23 = polyB->m_vertices;
      if (iVar15 < 3) {
        pbVar23 = polyB->m_vertices + (long)iVar15 + 1;
      }
      local_d8 = *(undefined8 *)pbVar23->m_floats;
      local_e8 = (float)((ulong)local_d8 >> 0x20);
      local_c8 = *(undefined8 *)(pbVar23->m_floats + 2);
      uStack_d0 = 0;
      fVar29 = (float)local_d8 - (float)local_198;
      uStack_190 = 0;
      fVar30 = local_e8 - fVar33;
      uStack_c0 = 0;
      fVar25 = (float)local_c8 - fVar32;
      fVar26 = fVar25 * fVar41 + fVar29 * fVar40 + fVar30 * fVar38;
      fVar28 = fVar25 * fVar27 + fVar29 * fVar37 + fVar30 * fVar43;
      fVar29 = fVar2 * fVar29 + fVar1 * fVar30 + fVar34 * fVar25;
      local_1b8.m_floats[1] = fVar28;
      local_1b8.m_floats[0] = fVar26;
      local_1b8.m_floats[2] = fVar29;
      local_1b8.m_floats[3] = 0.0;
      local_1a8 = ZEXT416((uint)fVar26);
      fVar25 = fVar29 * fVar29 + fVar26 * fVar26 + fVar28 * fVar28;
      fStack_e4 = local_e8;
      fStack_e0 = local_e8;
      fStack_dc = local_e8;
      if (fVar25 < 0.0) {
        fVar25 = sqrtf(fVar25);
        fVar43 = (float)local_158._0_4_;
        fVar41 = (float)local_168._0_4_;
        fVar37 = (float)local_148._0_4_;
        fVar27 = (float)local_138._0_4_;
        fVar38 = (float)local_188._0_4_;
        fVar40 = (float)local_178._0_4_;
      }
      else {
        fVar25 = SQRT(fVar25);
      }
      bVar13.m_floats = local_1b8.m_floats;
      fVar25 = 1.0 / fVar25;
      local_1b8.m_floats[0] = (float)local_1a8._0_4_ * fVar25;
      fVar28 = fVar28 * fVar25;
      local_f8 = fVar29 * fVar25;
      fVar41 = fVar32 * fVar41 + (float)local_198 * fVar40 + fVar38 * fVar33 + fVar7;
      fVar27 = fVar32 * fVar27 + (float)local_198 * fVar37 + fVar43 * fVar33 + fVar6;
      fVar43 = fVar32 * fVar34 + (float)local_198 * fVar2 + fVar1 * fVar33 + fVar5;
      local_58.v.m_floats[0] = 0.0;
      local_58.v.m_floats[1] = 0.0;
      local_58.v.m_floats[2] = 0.0;
      local_58.v.m_floats[3] = 0.0;
      local_44 = 0;
      uStack_3c = 0;
      local_b8.v.m_floats[0] = 0.0;
      local_b8.v.m_floats[1] = 0.0;
      local_b8.v.m_floats[2] = 0.0;
      local_b8.v.m_floats[3] = 0.0;
      local_a4 = 0;
      uStack_9c = 0;
      local_198 = CONCAT44(local_1a8._4_4_,-local_1b8.m_floats[0]) ^ 0x8000000000000000;
      uStack_190 = local_1a8._8_8_ ^ 0x8000000080000000;
      local_1d8 = -fVar28;
      uVar20 = CONCAT44(fVar28,local_1b8.m_floats[0]) ^ 0x8000000080000000;
      local_108.m_floats[2] = -local_f8;
      local_108.m_floats[0] = (btScalar)(int)uVar20;
      local_108.m_floats[1] = (btScalar)(int)(uVar20 >> 0x20);
      local_108.m_floats[3] = 0.0;
      local_1a8._0_4_ = local_1b8.m_floats[0];
      local_1b8.m_floats[2] = local_f8;
      local_1b8.m_floats[1] = fVar28;
      local_1b8.m_floats[3] = bVar13.m_floats[3];
      fStack_f4 = local_f8;
      fStack_f0 = local_f8;
      fStack_ec = local_f8;
      iVar15 = ClipSegmentToLine(&local_58,&local_88,&local_108,
                                 -(local_f8 * fVar43 +
                                  local_1b8.m_floats[0] * fVar41 + fVar27 * fVar28));
      if (1 < iVar15) {
        vOut = &local_b8;
        iVar15 = ClipSegmentToLine(vOut,&local_58,&local_1b8,
                                   (fVar5 + fVar34 * (float)local_c8 +
                                            fVar2 * (float)local_d8 + fVar1 * local_e8) * local_f8 +
                                   (fVar7 + (float)local_168._0_4_ * (float)local_c8 +
                                            (float)local_178._0_4_ * (float)local_d8 +
                                            (float)local_188._0_4_ * local_e8) *
                                   (float)local_1a8._0_4_ +
                                   (fVar6 + (float)local_138._0_4_ * (float)local_c8 +
                                            (float)local_148._0_4_ * (float)local_d8 +
                                            (float)local_158._0_4_ * local_e8) * fVar28);
        if ((1 < iVar15) && (0 < b2_maxManifoldPoints)) {
          fVar27 = fVar27 * (float)local_1a8._0_4_;
          fVar34 = (float)local_1a8._0_4_;
          if (bVar24 <= local_128) {
            local_1d8 = fVar28;
            fVar34 = (float)local_198;
          }
          bVar10 = bVar24 <= local_128;
          uVar20 = CONCAT44(fVar34,local_1d8) ^ 0x8000000080000000;
          lVar17 = 0;
          do {
            if (((vOut->v).m_floats[2] * 0.0 +
                (vOut->v).m_floats[0] * fVar28 + (vOut->v).m_floats[1] * (float)local_198) -
                (fVar43 * 0.0 + (fVar41 * fVar28 - fVar27)) <= 0.0) {
              local_108.m_floats[2] = (btScalar)(-(uint)bVar10 & 0x80000000);
              local_108.m_floats[0] = (btScalar)(int)uVar20;
              local_108.m_floats[1] = (btScalar)(int)(uVar20 >> 0x20);
              local_108.m_floats[3] = 0.0;
              (*(pbVar14->super_Result)._vptr_Result[4])(pbVar14,&local_108,vOut);
            }
            lVar17 = lVar17 + 1;
            vOut = vOut + 1;
          } while (lVar17 < b2_maxManifoldPoints);
        }
      }
    }
  }
  return;
}

Assistant:

void b2CollidePolygons(btManifoldResult* manifold,
					  const btBox2dShape* polyA, const btTransform& xfA,
					  const btBox2dShape* polyB, const btTransform& xfB)
{

	int edgeA = 0;
	btScalar separationA = FindMaxSeparation(&edgeA, polyA, xfA, polyB, xfB);
	if (separationA > 0.0f)
		return;

	int edgeB = 0;
	btScalar separationB = FindMaxSeparation(&edgeB, polyB, xfB, polyA, xfA);
	if (separationB > 0.0f)
		return;

	const btBox2dShape* poly1;	// reference poly
	const btBox2dShape* poly2;	// incident poly
	btTransform xf1, xf2;
	int edge1;		// reference edge
	unsigned char flip;
	const btScalar k_relativeTol = 0.98f;
	const btScalar k_absoluteTol = 0.001f;

	// TODO_ERIN use "radius" of poly for absolute tolerance.
	if (separationB > k_relativeTol * separationA + k_absoluteTol)
	{
		poly1 = polyB;
		poly2 = polyA;
		xf1 = xfB;
		xf2 = xfA;
		edge1 = edgeB;
		flip = 1;
	}
	else
	{
		poly1 = polyA;
		poly2 = polyB;
		xf1 = xfA;
		xf2 = xfB;
		edge1 = edgeA;
		flip = 0;
	}

	ClipVertex incidentEdge[2];
	FindIncidentEdge(incidentEdge, poly1, xf1, edge1, poly2, xf2);

	int count1 = poly1->getVertexCount();
	const btVector3* vertices1 = poly1->getVertices();

	btVector3 v11 = vertices1[edge1];
	btVector3 v12 = edge1 + 1 < count1 ? vertices1[edge1+1] : vertices1[0];

	//btVector3 dv = v12 - v11;
	btVector3 sideNormal = b2Mul(xf1.getBasis(), v12 - v11);
	sideNormal.normalize();
	btVector3 frontNormal = btCrossS(sideNormal, 1.0f);
	
	
	v11 = b2Mul(xf1, v11);
	v12 = b2Mul(xf1, v12);

	btScalar frontOffset = b2Dot(frontNormal, v11);
	btScalar sideOffset1 = -b2Dot(sideNormal, v11);
	btScalar sideOffset2 = b2Dot(sideNormal, v12);

	// Clip incident edge against extruded edge1 side edges.
	ClipVertex clipPoints1[2];
	clipPoints1[0].v.setValue(0,0,0);
	clipPoints1[1].v.setValue(0,0,0);

	ClipVertex clipPoints2[2];
	clipPoints2[0].v.setValue(0,0,0);
	clipPoints2[1].v.setValue(0,0,0);


	int np;

	// Clip to box side 1
	np = ClipSegmentToLine(clipPoints1, incidentEdge, -sideNormal, sideOffset1);

	if (np < 2)
		return;

	// Clip to negative box side 1
	np = ClipSegmentToLine(clipPoints2, clipPoints1,  sideNormal, sideOffset2);

	if (np < 2)
	{
		return;
	}

	// Now clipPoints2 contains the clipped points.
	btVector3 manifoldNormal = flip ? -frontNormal : frontNormal;

	int pointCount = 0;
	for (int i = 0; i < b2_maxManifoldPoints; ++i)
	{
		btScalar separation = b2Dot(frontNormal, clipPoints2[i].v) - frontOffset;

		if (separation <= 0.0f)
		{
			
			//b2ManifoldPoint* cp = manifold->points + pointCount;
			//btScalar separation = separation;
			//cp->localPoint1 = b2MulT(xfA, clipPoints2[i].v);
			//cp->localPoint2 = b2MulT(xfB, clipPoints2[i].v);

			manifold->addContactPoint(-manifoldNormal,clipPoints2[i].v,separation);

//			cp->id = clipPoints2[i].id;
//			cp->id.features.flip = flip;
			++pointCount;
		}
	}

//	manifold->pointCount = pointCount;}
}